

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O2

int Scl_CommandResetConstr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Scl_Con_t *p;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    p = (Scl_Con_t *)argv;
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 != 0x76) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    iVar2 = 0;
    Abc_FrameSetDrivingCell((char *)0x0);
    Abc_FrameSetMaxLoad(0.0);
    Scl_ConUpdateMan(pAbc,p);
  }
  else {
    fwrite("usage: reset_constr [-vh] <file>\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\t         removes current timing constraints\n",0x2d,1,(FILE *)pAbc->Err);
    pcVar3 = "yes";
    if (!bVar1) {
      pcVar3 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",
            pcVar3);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\t<file> : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Scl_CommandResetConstr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    Abc_FrameSetDrivingCell( NULL );
    Abc_FrameSetMaxLoad( 0 );

    Scl_ConUpdateMan( pAbc, NULL );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: reset_constr [-vh] <file>\n" );
    fprintf( pAbc->Err, "\t         removes current timing constraints\n" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file> : the name of a file to read\n" );
    return 1;
}